

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O2

Constraint *
slang::ast::ForeachConstraint::fromSyntax(LoopConstraintSyntax *syntax,ASTContext *context)

{
  Compilation *compilation;
  Scope *pSVar1;
  int iVar2;
  int iVar3;
  LoopDim *dim;
  Expression *args;
  pointer pLVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Expression *ctrl;
  Expression *pEVar5;
  long lVar6;
  EVP_PKEY_CTX *src;
  SmallVector<slang::ast::ForeachLoopStatement::LoopDim,_4UL> dims;
  ASTContext iterCtx;
  span<slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL> local_e0;
  SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim> local_d0 [2];
  ASTContext local_58;
  
  compilation = ((context->scope).ptr)->compilation;
  local_58.assertionInstance = context->assertionInstance;
  local_58.scope.ptr = (context->scope).ptr;
  local_58.lookupIndex = context->lookupIndex;
  local_58._12_4_ = *(undefined4 *)&context->field_0xc;
  local_58.flags.m_bits = (context->flags).m_bits;
  local_58.instanceOrProc = context->instanceOrProc;
  local_58.firstTempVar = context->firstTempVar;
  local_58.randomizeDetails = context->randomizeDetails;
  local_d0[0].data_ = (pointer)local_d0[0].firstElement;
  local_d0[0].len = 0;
  local_d0[0].cap = 4;
  args = ForeachLoopStatement::buildLoopDims((syntax->loopList).ptr,&local_58,local_d0);
  if (args == (Expression *)0x0) {
    args = (Expression *)0x0;
    pEVar5 = (Expression *)Constraint::badConstraint(compilation,(Constraint *)0x0);
  }
  else {
    pSVar1 = (context->scope).ptr;
    pLVar4 = local_d0[0].data_;
    for (lVar6 = local_d0[0].len * 0x18; lVar6 != 0; lVar6 = lVar6 + -0x18) {
      if (pLVar4->loopVar != (IteratorSymbol *)0x0) {
        (pLVar4->loopVar->super_TempVarSymbol).super_VariableSymbol.super_ValueSymbol.super_Symbol.
        parentScope = pSVar1;
      }
      pLVar4 = pLVar4 + 1;
    }
    iVar2 = Constraint::bind((int)(syntax->constraints).ptr,(sockaddr *)&local_58,0);
    iVar3 = SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim>::copy
                      (local_d0,(EVP_PKEY_CTX *)compilation,src);
    local_e0._M_ptr = (pointer)CONCAT44(extraout_var_00,iVar3);
    ctrl = (Expression *)
           BumpAllocator::
           emplace<slang::ast::ForeachConstraint,slang::ast::Expression_const&,std::span<slang::ast::ForeachLoopStatement::LoopDim,18446744073709551615ul>,slang::ast::Constraint_const&>
                     (&compilation->super_BumpAllocator,args,&local_e0,
                      (Constraint *)CONCAT44(extraout_var,iVar2));
    pEVar5 = ctrl;
    if (((Constraint *)CONCAT44(extraout_var,iVar2))->kind == Invalid) {
      pEVar5 = (Expression *)Constraint::badConstraint(compilation,(Constraint *)ctrl);
      args = ctrl;
    }
  }
  SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim>::cleanup(local_d0,(EVP_PKEY_CTX *)args)
  ;
  return (Constraint *)pEVar5;
}

Assistant:

Constraint& ForeachConstraint::fromSyntax(const LoopConstraintSyntax& syntax,
                                          const ASTContext& context) {
    auto& comp = context.getCompilation();

    ASTContext iterCtx = context;
    SmallVector<ForeachLoopStatement::LoopDim, 4> dims;
    auto arrayRef = ForeachLoopStatement::buildLoopDims(*syntax.loopList, iterCtx, dims);
    if (!arrayRef)
        return badConstraint(comp, nullptr);

    // Set the parent pointer on the iterator variables in case
    // someone inspects them later. We just created these in the
    // method above so the const_cast is safe.
    for (auto& dim : dims) {
        if (dim.loopVar)
            const_cast<IteratorSymbol*>(dim.loopVar)->setParent(*context.scope);
    }

    auto& body = Constraint::bind(*syntax.constraints, iterCtx);
    auto result = comp.emplace<ForeachConstraint>(*arrayRef, dims.copy(comp), body);
    if (body.bad())
        return badConstraint(comp, result);

    return *result;
}